

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

int __thiscall QToolBarAreaLayoutInfo::distance(QToolBarAreaLayoutInfo *this,QPoint *pos)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  
  switch(*(undefined4 *)(in_RDI + 0x2c)) {
  case 0:
    iVar1 = QPoint::y((QPoint *)0x6f1fee);
    iVar2 = QRect::bottom((QRect *)0x6f2000);
    if (iVar1 < iVar2) {
      iVar1 = QPoint::x((QPoint *)0x6f2014);
      iVar2 = QRect::right((QRect *)0x6f2026);
      return iVar1 - iVar2;
    }
    break;
  case 1:
    iVar1 = QPoint::y((QPoint *)0x6f2046);
    iVar2 = QRect::bottom((QRect *)0x6f2058);
    if (iVar1 < iVar2) {
      iVar1 = QRect::left((QRect *)0x6f2070);
      iVar2 = QPoint::x((QPoint *)0x6f207e);
      return iVar1 - iVar2;
    }
    break;
  case 2:
    iVar1 = QPoint::x((QPoint *)0x6f209e);
    iVar2 = QRect::right((QRect *)0x6f20b0);
    if (iVar1 < iVar2) {
      iVar1 = QPoint::y((QPoint *)0x6f20c4);
      iVar2 = QRect::bottom((QRect *)0x6f20d6);
      return iVar1 - iVar2;
    }
    break;
  case 3:
    iVar1 = QPoint::x((QPoint *)0x6f20f0);
    iVar2 = QRect::right((QRect *)0x6f2102);
    if (iVar1 < iVar2) {
      iVar1 = QRect::top((QRect *)0x6f211a);
      iVar2 = QPoint::y((QPoint *)0x6f2127);
      return iVar1 - iVar2;
    }
    break;
  case 4:
  }
  return -1;
}

Assistant:

int QToolBarAreaLayoutInfo::distance(const QPoint &pos) const
{
    switch (dockPos) {
        case QInternal::LeftDock:
            if (pos.y() < rect.bottom())
                return pos.x() - rect.right();
            break;
        case QInternal::RightDock:
            if (pos.y() < rect.bottom())
                return rect.left() - pos.x();
            break;
        case QInternal::TopDock:
            if (pos.x() < rect.right())
                return pos.y() - rect.bottom();
            break;
        case QInternal::BottomDock:
            if (pos.x() < rect.right())
                return rect.top() - pos.y();
            break;

        case QInternal::DockCount:
            break;
    }
    return -1;
}